

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hdmp.cc
# Opt level: O0

void printStack(ostream *os,shared_ptr<pstack::Procman::Process> *proc,hdbg_info *info,void **frames
               )

{
  undefined8 uVar1;
  __tuple_element_t<0UL,_tuple<unsigned_long,_shared_ptr<Object>,_const_Elf64_Phdr_*>_> *p_Var2;
  __shared_ptr *this;
  ostream *poVar3;
  element_type *peVar4;
  pair<Elf64_Sym,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *__in;
  type *ptVar5;
  element_type *peVar6;
  reference __in_00;
  type *ptVar7;
  type_conflict1 *ptVar8;
  bool bVar9;
  type_conflict1 *line;
  type *file;
  __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>_>
  local_138;
  iterator __end4;
  iterator __begin4;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  *__range4;
  char *sep;
  undefined1 local_f0 [8];
  shared_ptr<pstack::Dwarf::Info> dwarf;
  type *name;
  type *sym;
  undefined1 local_c8 [8];
  optional<std::pair<Elf64_Sym,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  found;
  type *phdr;
  type *elf;
  type_conflict *elfReloc;
  tuple<unsigned_long,_std::shared_ptr<pstack::Elf::Object>,_const_Elf64_Phdr_*> *local_40;
  long local_38;
  uintptr_t frameip;
  size_t i;
  void **frames_local;
  hdbg_info *info_local;
  shared_ptr<pstack::Procman::Process> *proc_local;
  ostream *os_local;
  
  frameip = 0;
  i = (size_t)frames;
  frames_local = (void **)info;
  info_local = (hdbg_info *)proc;
  proc_local = (shared_ptr<pstack::Procman::Process> *)os;
  while( true ) {
    bVar9 = false;
    if (frameip < frames_local[0x11]) {
      bVar9 = *(long *)(i + frameip * 8) != 0;
    }
    if (!bVar9) break;
    local_38 = *(long *)(i + frameip * 8);
    if (frameip != 0) {
      local_38 = local_38 + -1;
    }
    std::__shared_ptr_access<pstack::Procman::Process,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<pstack::Procman::Process,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)info_local);
    pstack::Procman::Process::findSegment((ulong)&elfReloc);
    local_40 = (tuple<unsigned_long,_std::shared_ptr<pstack::Elf::Object>,_const_Elf64_Phdr_*> *)
               &elfReloc;
    p_Var2 = std::get<0ul,unsigned_long,std::shared_ptr<pstack::Elf::Object>,Elf64_Phdr_const*>
                       ((tuple<unsigned_long,_std::shared_ptr<pstack::Elf::Object>,_const_Elf64_Phdr_*>
                         *)&elfReloc);
    this = (__shared_ptr *)
           std::get<1ul,unsigned_long,std::shared_ptr<pstack::Elf::Object>,Elf64_Phdr_const*>
                     (local_40);
    std::get<2ul,unsigned_long,std::shared_ptr<pstack::Elf::Object>,Elf64_Phdr_const*>(local_40);
    poVar3 = std::operator<<((ostream *)proc_local,"\t");
    std::ostream::operator<<(poVar3,*(void **)(i + frameip * 8));
    bVar9 = std::__shared_ptr::operator_cast_to_bool(this);
    if (bVar9) {
      peVar4 = std::
               __shared_ptr_access<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
      pstack::Elf::Object::findSymbolByAddress_abi_cxx11_((ulong)local_c8,(int)peVar4);
      bVar9 = std::optional::operator_cast_to_bool((optional *)local_c8);
      if (bVar9) {
        __in = std::
               optional<std::pair<Elf64_Sym,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator*((optional<std::pair<Elf64_Sym,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_c8);
        ptVar5 = std::get<0ul,Elf64_Sym,std::__cxx11::string>(__in);
        dwarf.super___shared_ptr<pstack::Dwarf::Info,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
             = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               std::get<1ul,Elf64_Sym,std::__cxx11::string>(__in);
        poVar3 = std::operator<<((ostream *)proc_local,"\t");
        poVar3 = std::operator<<(poVar3,(string *)
                                        dwarf.
                                        super___shared_ptr<pstack::Dwarf::Info,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_refcount._M_pi);
        poVar3 = std::operator<<(poVar3,"+");
        std::ostream::operator<<(poVar3,(*(long *)(i + frameip * 8) - *p_Var2) - ptVar5->st_value);
      }
      peVar6 = std::
               __shared_ptr_access<pstack::Procman::Process,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<pstack::Procman::Process,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)info_local);
      uVar1 = *(undefined8 *)(peVar6 + 0xa0);
      std::shared_ptr<pstack::Elf::Object>::shared_ptr
                ((shared_ptr<pstack::Elf::Object> *)&sep,(shared_ptr<pstack::Elf::Object> *)this);
      pstack::Context::getDwarf(local_f0,uVar1,(shared_ptr<pstack::Elf::Object> *)&sep);
      std::shared_ptr<pstack::Elf::Object>::~shared_ptr((shared_ptr<pstack::Elf::Object> *)&sep);
      bVar9 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_f0);
      if (bVar9) {
        __range4 = (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                    *)anon_var_dwarf_79bf;
        std::__shared_ptr_access<pstack::Dwarf::Info,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<pstack::Dwarf::Info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)local_f0);
        pstack::Dwarf::Info::sourceFromAddr_abi_cxx11_((ulong)&__begin4);
        __end4 = std::
                 vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                 ::begin((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                          *)&__begin4);
        local_138._M_current =
             (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
              *)std::
                vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                ::end((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                       *)&__begin4);
        while (bVar9 = __gnu_cxx::
                       operator==<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>_>
                                 (&__end4,&local_138), ((bVar9 ^ 0xffU) & 1) != 0) {
          __in_00 = __gnu_cxx::
                    __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>_>
                    ::operator*(&__end4);
          ptVar7 = std::get<0ul,std::__cxx11::string,int>(__in_00);
          ptVar8 = std::get<1ul,std::__cxx11::string,int>(__in_00);
          poVar3 = std::operator<<((ostream *)proc_local," ");
          poVar3 = std::operator<<(poVar3,(char *)__range4);
          poVar3 = std::operator<<(poVar3," ");
          poVar3 = std::operator<<(poVar3,(string *)ptVar7);
          poVar3 = std::operator<<(poVar3,":");
          std::ostream::operator<<(poVar3,*ptVar8);
          __range4 = (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                      *)anon_var_dwarf_79ee;
          __gnu_cxx::
          __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>_>
          ::operator++(&__end4);
        }
        std::
        vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
        ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                   *)&__begin4);
      }
      std::shared_ptr<pstack::Dwarf::Info>::~shared_ptr((shared_ptr<pstack::Dwarf::Info> *)local_f0)
      ;
      std::
      optional<std::pair<Elf64_Sym,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~optional((optional<std::pair<Elf64_Sym,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_c8);
    }
    std::operator<<((ostream *)proc_local,"\n");
    std::tuple<unsigned_long,_std::shared_ptr<pstack::Elf::Object>,_const_Elf64_Phdr_*>::~tuple
              ((tuple<unsigned_long,_std::shared_ptr<pstack::Elf::Object>,_const_Elf64_Phdr_*> *)
               &elfReloc);
    frameip = frameip + 1;
  }
  std::operator<<((ostream *)proc_local,"\n");
  return;
}

Assistant:

void printStack(std::ostream &os, std::shared_ptr<Procman::Process> &proc, const hdbg_info &info, void **frames) {
   for (size_t i = 0; i < info.maxframes && frames[i] != nullptr; ++i) {
      uintptr_t frameip = uintptr_t(frames[i]);
      if (i != 0)
         frameip--;

      // find the segment containing the instruction pointer.
      auto &&[elfReloc, elf, phdr] = proc->findSegment(frameip);

      os << "\t" << frames[i];
      if (elf) {
         auto found = elf->findSymbolByAddress(frameip - elfReloc, STT_FUNC);
         if (found) {
            auto &[ sym, name ] = *found;
            os << "\t" << name << "+" << uintptr_t(frames[i]) - elfReloc - sym.st_value;
         }

         auto dwarf = proc->context.getDwarf(elf);
         if (dwarf) {
            auto sep = "in";
            for (auto &&[file, line] : dwarf->sourceFromAddr(frameip - elfReloc)) {
               os << " " << sep << " " << file << ":" << line;
               sep = ",";
            }
         }

      }
      os << "\n";
   }
   os << "\n";
}